

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcxtexture.cpp
# Opt level: O0

FTexture * PCXTexture_TryCreate(FileReader *file,int lumpnum)

{
  int iVar1;
  undefined4 extraout_var;
  int local_a0;
  undefined1 local_9c [4];
  int i;
  PCXHeader hdr;
  int lumpnum_local;
  FileReader *file_local;
  
  hdr.padding._46_4_ = lumpnum;
  unique0x10000189 = file;
  (*(file->super_FileReaderBase)._vptr_FileReaderBase[4])(file,0,0);
  iVar1 = (*(stack0xffffffffffffffe8->super_FileReaderBase)._vptr_FileReaderBase[2])
                    (stack0xffffffffffffffe8,local_9c,0x80);
  if (CONCAT44(extraout_var,iVar1) == 0x80) {
    if ((local_9c[0] == '\n') && (local_9c[2] == '\x01')) {
      if ((((local_9c[1] == '\0') || (local_9c[1] == '\x02')) || (local_9c[1] == '\x03')) ||
         ((local_9c[1] == '\x04' || (local_9c[1] == '\x05')))) {
        if ((local_9c[3] == '\x01') || (local_9c[3] == '\b')) {
          if (((local_9c[3] == '\x01') && (hdr.palette[0x29] != '\x01')) &&
             (hdr.palette[0x29] != '\x04')) {
            file_local = (FileReader *)0x0;
          }
          else if ((local_9c[3] == '\b') &&
                  ((uint)(ushort)hdr.palette._42_2_ !=
                   (((uint)(ushort)hdr._0_2_ - (uint)(ushort)i) + 2 & 0xfffffffe))) {
            file_local = (FileReader *)0x0;
          }
          else {
            for (local_a0 = 0; local_a0 < 0x36; local_a0 = local_a0 + 1) {
              if (hdr.padding[(long)local_a0 + -8] != '\0') {
                return (FTexture *)0x0;
              }
            }
            (*(stack0xffffffffffffffe8->super_FileReaderBase)._vptr_FileReaderBase[4])
                      (stack0xffffffffffffffe8,0);
            (*(stack0xffffffffffffffe8->super_FileReaderBase)._vptr_FileReaderBase[2])
                      (stack0xffffffffffffffe8,(PCXHeader *)local_9c,0x80);
            file_local = (FileReader *)operator_new(0xa8);
            FPCXTexture::FPCXTexture
                      ((FPCXTexture *)file_local,hdr.padding._46_4_,(PCXHeader *)local_9c);
          }
        }
        else {
          file_local = (FileReader *)0x0;
        }
      }
      else {
        file_local = (FileReader *)0x0;
      }
    }
    else {
      file_local = (FileReader *)0x0;
    }
  }
  else {
    file_local = (FileReader *)0x0;
  }
  return (FTexture *)file_local;
}

Assistant:

FTexture * PCXTexture_TryCreate(FileReader & file, int lumpnum)
{
	PCXHeader hdr;

	file.Seek(0, SEEK_SET);
	if (file.Read(&hdr, sizeof(hdr)) != sizeof(hdr))
	{
		return NULL;
	}

	hdr.xmin = LittleShort(hdr.xmin);
	hdr.xmax = LittleShort(hdr.xmax);
	hdr.bytesPerScanLine = LittleShort(hdr.bytesPerScanLine);

	if (hdr.manufacturer != 10 || hdr.encoding != 1) return NULL;
	if (hdr.version != 0 && hdr.version != 2 && hdr.version != 3 && hdr.version != 4 && hdr.version != 5) return NULL;
	if (hdr.bitsPerPixel != 1 && hdr.bitsPerPixel != 8) return NULL; 
	if (hdr.bitsPerPixel == 1 && hdr.numColorPlanes !=1 && hdr.numColorPlanes != 4) return NULL;
	if (hdr.bitsPerPixel == 8 && hdr.bytesPerScanLine != ((hdr.xmax - hdr.xmin + 2)&~1)) return NULL;

	for (int i = 0; i < 54; i++) 
	{
		if (hdr.padding[i] != 0) return NULL;
	}

	file.Seek(0, SEEK_SET);
	file.Read(&hdr, sizeof(hdr));

	return new FPCXTexture(lumpnum, hdr);
}